

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

bool __thiscall
chrono::ChSystem::DoStaticNonlinearRheonomic
          (ChSystem *this,int nsteps,bool verbose,
          shared_ptr<chrono::ChStaticNonLinearRheonomicAnalysis::IterationCallback> *mcallback)

{
  ChVisualSystem *pCVar1;
  int max_iters;
  int max_iters_00;
  __shared_ptr<chrono::ChStaticNonLinearRheonomicAnalysis::IterationCallback,_(__gnu_cxx::_Lock_policy)2>
  _Stack_a8;
  ChStaticNonLinearRheonomicAnalysis manalysis;
  
  if (this->is_initialized == false) {
    SetupInitial(this);
  }
  this->applied_forces_current = false;
  this->setupcount = 0;
  this->solvecount = 0;
  (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x3d])(this);
  Update(this,true);
  max_iters = GetSolverMaxIterations(this);
  max_iters_00 = 300;
  if (300 < max_iters) {
    max_iters_00 = max_iters;
  }
  SetSolverMaxIterations(this,max_iters_00);
  (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x3a])
            (this,(this->descriptor).
                  super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  ChStaticNonLinearRheonomicAnalysis::ChStaticNonLinearRheonomicAnalysis
            (&manalysis,&this->super_ChIntegrableIIorder);
  ChStaticNonLinearRheonomicAnalysis::SetMaxIterations(&manalysis,nsteps);
  manalysis.m_verbose = verbose;
  std::
  __shared_ptr<chrono::ChStaticNonLinearRheonomicAnalysis::IterationCallback,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&_Stack_a8,
                 &mcallback->
                  super___shared_ptr<chrono::ChStaticNonLinearRheonomicAnalysis::IterationCallback,_(__gnu_cxx::_Lock_policy)2>
                );
  std::
  __shared_ptr<chrono::ChStaticNonLinearRheonomicAnalysis::IterationCallback,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&manalysis.callback_iteration_begin.
               super___shared_ptr<chrono::ChStaticNonLinearRheonomicAnalysis::IterationCallback,_(__gnu_cxx::_Lock_policy)2>
              ,&_Stack_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a8._M_refcount);
  ChStaticNonLinearRheonomicAnalysis::StaticAnalysis(&manalysis);
  SetSolverMaxIterations(this,max_iters);
  pCVar1 = this->visual_system;
  if (pCVar1 != (ChVisualSystem *)0x0) {
    (**(code **)(*(long *)pCVar1 + 0x58))(pCVar1,this);
  }
  ChStaticNonLinearRheonomicAnalysis::~ChStaticNonLinearRheonomicAnalysis(&manalysis);
  return true;
}

Assistant:

bool ChSystem::DoStaticNonlinearRheonomic(int nsteps, bool verbose, std::shared_ptr<ChStaticNonLinearRheonomicAnalysis::IterationCallback> mcallback) {
    if (!is_initialized)
        SetupInitial();

    applied_forces_current = false;

    solvecount = 0;
    setupcount = 0;

    Setup();
    Update();

    int old_maxsteps = GetSolverMaxIterations();
    SetSolverMaxIterations(std::max(old_maxsteps, 300));

    // Prepare lists of variables and constraints.
    DescriptorPrepareInject(*descriptor);

    ChStaticNonLinearRheonomicAnalysis manalysis(*this);
    manalysis.SetMaxIterations(nsteps);
    manalysis.SetVerbose(verbose);
    manalysis.SetCallbackIterationBegin(mcallback);

    // Perform analysis
    manalysis.StaticAnalysis();

    SetSolverMaxIterations(old_maxsteps);

    // Update any attached visualization system
    if (visual_system)
        visual_system->OnUpdate(this);

    return true;
}